

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

void __thiscall Inferences::CompositeGIE::detach(CompositeGIE *this)

{
  GeneratingInferenceEngine *pGVar1;
  InferenceEngine *in_RDI;
  GIList *eit;
  List<Inferences::GeneratingInferenceEngine_*> *local_10;
  
  for (local_10 = (List<Inferences::GeneratingInferenceEngine_*> *)in_RDI[1]._vptr_InferenceEngine;
      local_10 != (List<Inferences::GeneratingInferenceEngine_*> *)0x0;
      local_10 = Lib::List<Inferences::GeneratingInferenceEngine_*>::tail(local_10)) {
    pGVar1 = Lib::List<Inferences::GeneratingInferenceEngine_*>::head(local_10);
    (*(pGVar1->super_SimplifyingGeneratingInference).super_InferenceEngine._vptr_InferenceEngine[3])
              ();
  }
  InferenceEngine::detach(in_RDI);
  return;
}

Assistant:

void CompositeGIE::detach()
{
  GIList* eit=_inners;
  while(eit) {
    eit->head()->detach();
    eit=eit->tail();
  }
  GeneratingInferenceEngine::detach();
}